

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::TestCaseInfo::tagsAsString_abi_cxx11_(string *__return_storage_ptr__,TestCaseInfo *this)

{
  bool bVar1;
  size_type sVar2;
  size_type sVar3;
  reference pTVar4;
  Tag *tag_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1_1;
  Tag *tag;
  const_iterator __end1;
  const_iterator __begin1;
  vector<Catch::Tag,_std::allocator<Catch::Tag>_> *__range1;
  size_t full_size;
  TestCaseInfo *this_local;
  string *ret;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  sVar2 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::size(&this->tags);
  __range1 = (vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)(sVar2 << 1);
  __end1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(&this->tags);
  tag = (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end(&this->tags);
  while (bVar1 = __gnu_cxx::
                 operator==<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                           (&__end1,(__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                                     *)&tag), ((bVar1 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
             ::operator*(&__end1);
    sVar3 = StringRef::size(&pTVar4->original);
    __range1 = (vector<Catch::Tag,_std::allocator<Catch::Tag>_> *)
               ((long)&(__range1->super__Vector_base<Catch::Tag,_std::allocator<Catch::Tag>_>).
                       _M_impl.super__Vector_impl_data._M_start + sVar3);
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&__end1);
  }
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::reserve
            (__return_storage_ptr__,(size_type)__range1);
  __end1_1 = std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::begin(&this->tags);
  tag_1 = (Tag *)std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>::end(&this->tags);
  while (bVar1 = __gnu_cxx::
                 operator==<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                           (&__end1_1,
                            (__normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
                             *)&tag_1), ((bVar1 ^ 0xffU) & 1) != 0) {
    pTVar4 = __gnu_cxx::
             __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>
             ::operator*(&__end1_1);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,'[');
    operator+=(__return_storage_ptr__,&pTVar4->original);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              (__return_storage_ptr__,']');
    __gnu_cxx::
    __normal_iterator<const_Catch::Tag_*,_std::vector<Catch::Tag,_std::allocator<Catch::Tag>_>_>::
    operator++(&__end1_1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TestCaseInfo::tagsAsString() const {
        std::string ret;
        // '[' and ']' per tag
        std::size_t full_size = 2 * tags.size();
        for (const auto &tag : tags) {
            full_size += tag.original.size();
        }
        ret.reserve(full_size);
        for (const auto &tag : tags) {
            ret.push_back('[');
            ret += tag.original;
            ret.push_back(']');
        }

        return ret;
    }